

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFeaturePrint.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::CoreMLModels::AudioFeaturePrint::ByteSizeLong(AudioFeaturePrint *this)

{
  AudioFeaturePrintTypeCase AVar1;
  int iVar2;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  AudioFeaturePrint *this_local;
  
  sStack_18 = 0;
  AVar1 = AudioFeaturePrintType_case(this);
  if ((AVar1 != AUDIOFEATUREPRINTTYPE_NOT_SET) && (AVar1 == kSound)) {
    sStack_18 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::CoreMLModels::AudioFeaturePrint_Sound>
                          ((this->AudioFeaturePrintType_).sound_);
    sStack_18 = sStack_18 + 2;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t AudioFeaturePrint::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CoreMLModels.AudioFeaturePrint)
  size_t total_size = 0;

  switch (AudioFeaturePrintType_case()) {
    // .CoreML.Specification.CoreMLModels.AudioFeaturePrint.Sound sound = 20;
    case kSound: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *AudioFeaturePrintType_.sound_);
      break;
    }
    case AUDIOFEATUREPRINTTYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}